

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O0

RAState * __thiscall asmjit::X86RAPass::saveState(X86RAPass *this)

{
  uint8_t *puVar1;
  Block *pBVar2;
  ulong *puVar3;
  long lVar4;
  RAState *pRVar5;
  ulong uVar6;
  Zone *in_RDI;
  X86StateCell *cell;
  VirtReg *vreg;
  uint32_t i;
  X86RAState *dst;
  X86RAState *cur;
  size_t size;
  uint32_t count;
  VirtReg **vregs;
  size_t remainingBytes;
  uint8_t *ptr;
  char *in_stack_00000320;
  int in_stack_0000032c;
  char *in_stack_00000330;
  uint local_bc;
  size_t in_stack_ffffffffffffff78;
  RAState *local_8;
  
  puVar1 = in_RDI[6]._end;
  pBVar2 = in_RDI[6]._block;
  uVar6 = ((ulong)pBVar2 & 0xffffffff) + 0x15f & 0xfffffffffffffff8;
  puVar3 = *(ulong **)&in_RDI->_blockSize;
  local_8 = (RAState *)*puVar3;
  if (puVar3[1] - (long)local_8 < uVar6) {
    local_8 = (RAState *)Zone::_alloc(in_RDI,in_stack_ffffffffffffff78);
  }
  else {
    *puVar3 = uVar6 + *puVar3;
    if (puVar3[1] < *puVar3) {
      DebugUtils::assertionFailed(in_stack_00000330,in_stack_0000032c,in_stack_00000320);
    }
  }
  if (local_8 == (RAState *)0x0) {
    local_8 = (RAState *)0x0;
  }
  else {
    memcpy(local_8,&in_RDI[10]._blockSize,0x140);
    *(undefined8 *)(local_8 + 0x140) = *(undefined8 *)&in_RDI[0x14]._blockSize;
    *(uint8_t **)(local_8 + 0x148) = in_RDI[0x15]._ptr;
    for (local_bc = 0; local_bc < (uint)pBVar2; local_bc = local_bc + 1) {
      lVar4 = *(long *)(puVar1 + (ulong)local_bc * 8);
      pRVar5 = local_8 + (ulong)local_bc + 0x150;
      *pRVar5 = (RAState)0x0;
      *pRVar5 = (RAState)((byte)*pRVar5 & 0xfc | *(byte *)(lVar4 + 0x24) & 3);
    }
  }
  return local_8;
}

Assistant:

RAState* X86RAPass::saveState() {
  VirtReg** vregs = _contextVd.getData();
  uint32_t count = static_cast<uint32_t>(_contextVd.getLength());

  size_t size = Utils::alignTo<size_t>(
    sizeof(X86RAState) + count * sizeof(X86StateCell), sizeof(void*));

  X86RAState* cur = getState();
  X86RAState* dst = _zone->allocT<X86RAState>(size);
  if (!dst) return nullptr;

  // Store links.
  ::memcpy(dst->_list, cur->_list, X86RAState::kAllCount * sizeof(VirtReg*));

  // Store masks.
  dst->_occupied = cur->_occupied;
  dst->_modified = cur->_modified;

  // Store cells.
  for (uint32_t i = 0; i < count; i++) {
    VirtReg* vreg = static_cast<VirtReg*>(vregs[i]);
    X86StateCell& cell = dst->_cells[i];

    cell.reset();
    cell.setState(vreg->getState());
  }

  return dst;
}